

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ocsp.cc
# Opt level: O2

int i2r_ocsp_acutoff(X509V3_EXT_METHOD *method,void *cutoff,BIO *bp,int ind)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 0;
  iVar1 = BIO_printf((BIO *)bp,"%*s",(ulong)(uint)ind,"");
  if (0 < iVar1) {
    iVar1 = ASN1_GENERALIZEDTIME_print((BIO *)bp,(ASN1_GENERALIZEDTIME *)cutoff);
    uVar2 = (uint)(iVar1 != 0);
  }
  return uVar2;
}

Assistant:

static int i2r_ocsp_acutoff(const X509V3_EXT_METHOD *method, void *cutoff,
                            BIO *bp, int ind) {
  if (BIO_printf(bp, "%*s", ind, "") <= 0) {
    return 0;
  }
  if (!ASN1_GENERALIZEDTIME_print(
          bp, reinterpret_cast<ASN1_GENERALIZEDTIME *>(cutoff))) {
    return 0;
  }
  return 1;
}